

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_image(nk_command_buffer *b,nk_rect r,nk_image *img,nk_color col)

{
  float fVar1;
  void *pvVar2;
  float local_48;
  float local_44;
  nk_rect *c;
  nk_command_image *cmd;
  nk_image *img_local;
  nk_command_buffer *b_local;
  float fStack_18;
  nk_color col_local;
  nk_rect r_local;
  
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x2350,
                  "void nk_draw_image(struct nk_command_buffer *, struct nk_rect, const struct nk_image *, struct nk_color)"
                 );
  }
  if (b != (nk_command_buffer *)0x0) {
    fStack_18 = r.x;
    col_local = (nk_color)r.y;
    r_local.x = r.w;
    r_local.y = r.h;
    if (b->use_clipping != 0) {
      fVar1 = (b->clip).w;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      fVar1 = (b->clip).h;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        return;
      }
      if (fStack_18 + r_local.x < (b->clip).x) {
        return;
      }
      if ((b->clip).x + (b->clip).w < fStack_18) {
        return;
      }
      if ((float)col_local + r_local.y < (b->clip).y) {
        return;
      }
      if ((b->clip).y + (b->clip).h < (float)col_local) {
        return;
      }
    }
    pvVar2 = nk_command_buffer_push(b,NK_COMMAND_IMAGE,0x38);
    if (pvVar2 != (void *)0x0) {
      *(short *)((long)pvVar2 + 0x10) = (short)(int)fStack_18;
      *(short *)((long)pvVar2 + 0x12) = (short)(int)(float)col_local;
      if (r_local.x <= 0.0) {
        local_44 = 0.0;
      }
      else {
        local_44 = r_local.x;
      }
      *(short *)((long)pvVar2 + 0x14) = (short)(int)local_44;
      if (r_local.y <= 0.0) {
        local_48 = 0.0;
      }
      else {
        local_48 = r_local.y;
      }
      *(short *)((long)pvVar2 + 0x16) = (short)(int)local_48;
      *(nk_handle *)((long)pvVar2 + 0x18) = img->handle;
      *(undefined8 *)((long)pvVar2 + 0x20) = *(undefined8 *)&img->w;
      *(undefined8 *)((long)pvVar2 + 0x28) = *(undefined8 *)(img->region + 2);
      *(nk_color *)((long)pvVar2 + 0x30) = col;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_image(struct nk_command_buffer *b, struct nk_rect r,
    const struct nk_image *img, struct nk_color col)
{
    struct nk_command_image *cmd;
    NK_ASSERT(b);
    if (!b) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    cmd = (struct nk_command_image*)
        nk_command_buffer_push(b, NK_COMMAND_IMAGE, sizeof(*cmd));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)NK_MAX(0, r.w);
    cmd->h = (unsigned short)NK_MAX(0, r.h);
    cmd->img = *img;
    cmd->col = col;
}